

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

bool __thiscall
ExternalSigner::SignTransaction
          (ExternalSigner *this,PartiallySignedTransaction *psbtx,string *error)

{
  long lVar1;
  PSBTInput *pPVar2;
  Span<const_unsigned_char> input;
  bool bVar3;
  UniValue *pUVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar6;
  long lVar7;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> _Var8;
  __normal_iterator<PSBTInput_*,_std::vector<PSBTInput,_std::allocator<PSBTInput>_>_> __it;
  long in_FS_OFFSET;
  string_view hex_str;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> parsed_m_fingerprint;
  undefined1 local_238 [32];
  string local_218;
  PartiallySignedTransaction signer_psbtx;
  UniValue signer_result;
  string signer_psbt_error;
  string stdinStr;
  string command;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_238._16_8_ = (pointer)0x0;
  local_238._24_8_ = 0;
  local_238._0_8_ = (pointer)0x0;
  local_238._8_8_ = (pointer)0x0;
  PartiallySignedTransaction::Serialize<DataStream>(psbtx,(DataStream *)local_238);
  hex_str._M_str = (this->m_fingerprint)._M_dataplus._M_p;
  hex_str._M_len = (this->m_fingerprint)._M_string_length;
  ParseHex<unsigned_char>(&parsed_m_fingerprint,hex_str);
  __it._M_current =
       (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
       super__Vector_impl_data._M_start;
  pPVar2 = (psbtx->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pPVar2 - (long)__it._M_current;
  signer_psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin.
  super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&parsed_m_fingerprint;
  for (lVar7 = lVar6 / 800 >> 2; _Var8._M_current = __it._M_current, 0 < lVar7; lVar7 = lVar7 + -1)
  {
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)&signer_psbtx,__it);
    if (bVar3) goto LAB_00a848ec;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)&signer_psbtx,__it._M_current + 1);
    _Var8._M_current = __it._M_current + 1;
    if (bVar3) goto LAB_00a848ec;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)&signer_psbtx,__it._M_current + 2);
    _Var8._M_current = __it._M_current + 2;
    if (bVar3) goto LAB_00a848ec;
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)&signer_psbtx,__it._M_current + 3);
    _Var8._M_current = __it._M_current + 3;
    if (bVar3) goto LAB_00a848ec;
    __it._M_current = __it._M_current + 4;
    lVar6 = lVar6 + -0xc80;
  }
  lVar6 = lVar6 / 800;
  if (lVar6 == 1) {
LAB_00a84ce5:
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
            ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                          *)&signer_psbtx,__it);
    _Var8._M_current = __it._M_current;
    if (!bVar3) {
      _Var8._M_current = pPVar2;
    }
LAB_00a848ec:
    if (_Var8._M_current != pPVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &signer_result,&this->m_command," --stdin --fingerprint ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &signer_psbtx,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &signer_result,&this->m_fingerprint);
      NetworkArg_abi_cxx11_(&stdinStr,this);
      std::operator+(&command,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &signer_psbtx,&stdinStr);
      std::__cxx11::string::~string((string *)&stdinStr);
      std::__cxx11::string::~string((string *)&signer_psbtx);
      std::__cxx11::string::~string((string *)&signer_result);
      DataStream::str_abi_cxx11_((string *)&signer_result,(DataStream *)local_238);
      EncodeBase64_abi_cxx11_
                ((string *)&signer_psbtx,(Span<const_unsigned_char>)signer_result._0_16_);
      std::operator+(&stdinStr,"signtx ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &signer_psbtx);
      std::__cxx11::string::~string((string *)&signer_psbtx);
      std::__cxx11::string::~string((string *)&signer_result);
      RunCommandParseJSON(&signer_result,&command,&stdinStr);
      key._M_str = "error";
      key._M_len = 5;
      pUVar4 = UniValue::find_value(&signer_result,key);
      if (pUVar4->typ == VSTR) {
        key_00._M_str = "error";
        key_00._M_len = 5;
        pUVar4 = UniValue::find_value(&signer_result,key_00);
        psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (error,psVar5);
LAB_00a84c29:
        bVar3 = false;
      }
      else {
        key_01._M_str = "psbt";
        key_01._M_len = 4;
        pUVar4 = UniValue::find_value(&signer_result,key_01);
        if (pUVar4->typ != VSTR) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                    (error,"Unexpected result from signer");
          goto LAB_00a84c29;
        }
        signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header;
        signer_psbtx.tx.super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
        super__Optional_payload<CMutableTransaction,_true,_false,_false>.
        super__Optional_payload_base<CMutableTransaction>._M_engaged = false;
        signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header;
        signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
        ;
        signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        signer_psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        signer_psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        signer_psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        signer_psbtx.inputs.super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        signer_psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        signer_psbtx.outputs.super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        signer_psbtx.m_version.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged = false;
        signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header;
        signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &signer_psbt_error.field_2;
        signer_psbt_error._M_string_length = 0;
        signer_psbt_error.field_2._M_local_buf[0] = '\0';
        key_02._M_str = "psbt";
        key_02._M_len = 4;
        signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             signer_psbtx.m_xpubs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             signer_psbtx.unknown._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             signer_psbtx.m_proprietary._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        signer_psbt_error._M_dataplus._M_p = (pointer)args;
        pUVar4 = UniValue::find_value(&signer_result,key_02);
        psVar5 = UniValue::get_str_abi_cxx11_(pUVar4);
        bVar3 = DecodeBase64PSBT(&signer_psbtx,psVar5,&signer_psbt_error);
        if (bVar3) {
          PartiallySignedTransaction::operator=(psbtx,&signer_psbtx);
        }
        else {
          tinyformat::format<std::__cxx11::string>
                    (&local_218,(tinyformat *)"TX decode failed %s",(char *)&signer_psbt_error,args)
          ;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (error,&local_218);
          std::__cxx11::string::~string((string *)&local_218);
        }
        std::__cxx11::string::~string((string *)&signer_psbt_error);
        PartiallySignedTransaction::~PartiallySignedTransaction(&signer_psbtx);
      }
      UniValue::~UniValue(&signer_result);
      std::__cxx11::string::~string((string *)&stdinStr);
      std::__cxx11::string::~string((string *)&command);
      goto LAB_00a84ca1;
    }
  }
  else {
    if (lVar6 == 2) {
LAB_00a848c0:
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)&signer_psbtx,__it);
      _Var8._M_current = __it._M_current;
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00a84ce5;
      }
      goto LAB_00a848ec;
    }
    if (lVar6 == 3) {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::$_0>
              ::operator()((_Iter_pred<ExternalSigner::SignTransaction(PartiallySignedTransaction&,std::__cxx11::string&)::__0>
                            *)&signer_psbtx,__it);
      if (!bVar3) {
        __it._M_current = __it._M_current + 1;
        goto LAB_00a848c0;
      }
      goto LAB_00a848ec;
    }
  }
  std::operator+(&command,"Signer fingerprint ",&this->m_fingerprint);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&signer_result
                 ,&command," does not match any of the inputs:\n");
  DataStream::str_abi_cxx11_(&signer_psbt_error,(DataStream *)local_238);
  input.m_size = signer_psbt_error._M_string_length;
  input.m_data = (uchar *)signer_psbt_error._M_dataplus._M_p;
  EncodeBase64_abi_cxx11_(&stdinStr,input);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&signer_psbtx,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&signer_result
                 ,&stdinStr);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (error,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &signer_psbtx);
  std::__cxx11::string::~string((string *)&signer_psbtx);
  std::__cxx11::string::~string((string *)&stdinStr);
  std::__cxx11::string::~string((string *)&signer_psbt_error);
  std::__cxx11::string::~string((string *)&signer_result);
  std::__cxx11::string::~string((string *)&command);
  bVar3 = false;
LAB_00a84ca1:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&parsed_m_fingerprint.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
            );
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_238);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool ExternalSigner::SignTransaction(PartiallySignedTransaction& psbtx, std::string& error)
{
    // Serialize the PSBT
    DataStream ssTx{};
    ssTx << psbtx;
    // parse ExternalSigner master fingerprint
    std::vector<unsigned char> parsed_m_fingerprint = ParseHex(m_fingerprint);
    // Check if signer fingerprint matches any input master key fingerprint
    auto matches_signer_fingerprint = [&](const PSBTInput& input) {
        for (const auto& entry : input.hd_keypaths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.fingerprint)) return true;
        }
        for (const auto& entry : input.m_tap_bip32_paths) {
            if (std::ranges::equal(parsed_m_fingerprint, entry.second.second.fingerprint)) return true;
        }
        return false;
    };

    if (!std::any_of(psbtx.inputs.begin(), psbtx.inputs.end(), matches_signer_fingerprint)) {
        error = "Signer fingerprint " + m_fingerprint + " does not match any of the inputs:\n" + EncodeBase64(ssTx.str());
        return false;
    }

    const std::string command = m_command + " --stdin --fingerprint " + m_fingerprint + NetworkArg();
    const std::string stdinStr = "signtx " + EncodeBase64(ssTx.str());

    const UniValue signer_result = RunCommandParseJSON(command, stdinStr);

    if (signer_result.find_value("error").isStr()) {
        error = signer_result.find_value("error").get_str();
        return false;
    }

    if (!signer_result.find_value("psbt").isStr()) {
        error = "Unexpected result from signer";
        return false;
    }

    PartiallySignedTransaction signer_psbtx;
    std::string signer_psbt_error;
    if (!DecodeBase64PSBT(signer_psbtx, signer_result.find_value("psbt").get_str(), signer_psbt_error)) {
        error = strprintf("TX decode failed %s", signer_psbt_error);
        return false;
    }

    psbtx = signer_psbtx;

    return true;
}